

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddLCache.c
# Opt level: O1

DdLocalCache * cuddLocalCacheInit(DdManager *manager,uint keySize,uint cacheSize,uint maxCacheSize)

{
  double dVar1;
  int iVar2;
  DdLocalCache *__ptr;
  DdLocalCacheItem *__s;
  uint uVar3;
  ulong __size;
  
  __ptr = (DdLocalCache *)malloc(0x48);
  if (__ptr == (DdLocalCache *)0x0) {
    manager->errorCode = CUDD_MEMORY_OUT;
  }
  else {
    __ptr->manager = manager;
    __ptr->keysize = keySize;
    __ptr->itemsize = keySize * 8 + 8;
    uVar3 = manager->slots >> 1;
    if (uVar3 <= cacheSize) {
      uVar3 = cacheSize;
    }
    iVar2 = cuddComputeFloorLog2(uVar3);
    __size = (ulong)(__ptr->itemsize << ((byte)iVar2 & 0x1f));
    __s = (DdLocalCacheItem *)malloc(__size);
    __ptr->item = __s;
    if (__s != (DdLocalCacheItem *)0x0) {
      uVar3 = 1 << ((byte)iVar2 & 0x1f);
      __ptr->slots = uVar3;
      __ptr->shift = 0x20 - iVar2;
      if (manager->slots < maxCacheSize) {
        maxCacheSize = manager->slots;
      }
      __ptr->maxslots = maxCacheSize;
      dVar1 = manager->minHit;
      __ptr->minHit = dVar1;
      __ptr->lookUps = (double)(int)((double)uVar3 * dVar1 + 1.0);
      __ptr->hits = 0.0;
      manager->memused = manager->memused + __size + 0x48;
      memset(__s,0,__size);
      __ptr->next = __ptr->manager->localCaches;
      __ptr->manager->localCaches = __ptr;
      return __ptr;
    }
    manager->errorCode = CUDD_MEMORY_OUT;
    free(__ptr);
  }
  return (DdLocalCache *)0x0;
}

Assistant:

DdLocalCache *
cuddLocalCacheInit(
  DdManager * manager /* manager */,
  unsigned int  keySize /* size of the key (number of operands) */,
  unsigned int  cacheSize /* Initial size of the cache */,
  unsigned int  maxCacheSize /* Size of the cache beyond which no resizing occurs */)
{
    DdLocalCache *cache;
    int logSize;

    cache = ABC_ALLOC(DdLocalCache,1);
    if (cache == NULL) {
        manager->errorCode = CUDD_MEMORY_OUT;
        return(NULL);
    }
    cache->manager = manager;
    cache->keysize = keySize;
    cache->itemsize = (keySize + 1) * sizeof(DdNode *);
#ifdef DD_CACHE_PROFILE
    cache->itemsize += sizeof(ptrint);
#endif
    logSize = cuddComputeFloorLog2(ddMax(cacheSize,manager->slots/2));
    cacheSize = 1 << logSize;
    cache->item = (DdLocalCacheItem *)
        ABC_ALLOC(char, cacheSize * cache->itemsize);
    if (cache->item == NULL) {
        manager->errorCode = CUDD_MEMORY_OUT;
        ABC_FREE(cache);
        return(NULL);
    }
    cache->slots = cacheSize;
    cache->shift = sizeof(int) * 8 - logSize;
    cache->maxslots = ddMin(maxCacheSize,manager->slots);
    cache->minHit = manager->minHit;
    /* Initialize to avoid division by 0 and immediate resizing. */
    cache->lookUps = (double) (int) (cacheSize * cache->minHit + 1);
    cache->hits = 0;
    manager->memused += cacheSize * cache->itemsize + sizeof(DdLocalCache);

    /* Initialize the cache. */
    memset(cache->item, 0, (size_t)(cacheSize * cache->itemsize));

    /* Add to manager's list of local caches for GC. */
    cuddLocalCacheAddToList(cache);

    return(cache);

}